

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODRowReader.h
# Opt level: O1

int ZXing::OneD::RowReader::
    DecodeDigit<ZXing::PatternView,std::array<ZXing::FixedPattern<5,15,false>,10ul>>
              (PatternView *counters,array<ZXing::FixedPattern<5,_15,_false>,_10UL> *patterns,
              float maxAvgVariance,float maxIndividualVariance,bool requireUnambiguousMatch)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int i;
  long lVar4;
  float fVar5;
  float local_30;
  
  iVar3 = -1;
  lVar4 = 0;
  local_30 = maxAvgVariance;
  do {
    fVar5 = PatternMatchVariance<unsigned_short,unsigned_short>
                      (counters->_data,(unsigned_short *)patterns,(long)counters->_size,
                       maxIndividualVariance);
    iVar2 = (int)lVar4;
    if (local_30 <= fVar5) {
      iVar2 = iVar3;
    }
    fVar1 = local_30;
    if (fVar5 < local_30 || !requireUnambiguousMatch) {
      fVar1 = fVar5;
      iVar3 = iVar2;
      if (local_30 <= fVar5) {
        fVar1 = local_30;
      }
    }
    else if ((fVar5 == local_30) && (!NAN(fVar5) && !NAN(local_30))) {
      iVar3 = -1;
    }
    local_30 = fVar1;
    lVar4 = lVar4 + 1;
    patterns = (array<ZXing::FixedPattern<5,_15,_false>,_10UL> *)((long)patterns + 10);
  } while (lVar4 != 10);
  return iVar3;
}

Assistant:

static int DecodeDigit(const Counters& counters, const Patterns& patterns, float maxAvgVariance,
						   float maxIndividualVariance, bool requireUnambiguousMatch = true)
	{
		float bestVariance = maxAvgVariance; // worst variance we'll accept
		constexpr int INVALID_MATCH = -1;
		int bestMatch = INVALID_MATCH;
		for (int i = 0; i < Size(patterns); i++) {
			float variance = PatternMatchVariance(counters, patterns[i], maxIndividualVariance);
			if (variance < bestVariance) {
				bestVariance = variance;
				bestMatch = i;
			} else if (requireUnambiguousMatch && variance == bestVariance) {
				// if we find a second 'best match' with the same variance, we can not reliably report to have a suitable match
				bestMatch = INVALID_MATCH;
			}
		}
		return bestMatch;
	}